

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

char * pathdup(char *path)

{
  size_t sVar1;
  size_t __n;
  char *__dest;
  __int32_t **pp_Var2;
  int *piVar3;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(path);
    do {
      __n = sVar1;
      if (__n == 0) break;
      sVar1 = __n - 1;
    } while (path[__n - 1] == '/');
    __dest = (char *)malloc(__n + 1);
    if (__dest == (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      error("malloc()");
    }
    if (L_opt == '\x01') {
      for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
        pp_Var2 = __ctype_tolower_loc();
        __dest[sVar1] = (char)(*pp_Var2)[(byte)path[sVar1]];
      }
    }
    else {
      memcpy(__dest,path,__n);
    }
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char *
pathdup(const char *path)
{
	char *str;
	size_t i, len;

	if (path == NULL || path[0] == '\0')
		return (NULL);

	len = strlen(path);
	while (len && path[len - 1] == '/')
		len--;
	if ((str = malloc(len + 1)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	if (L_opt) {
		for (i = 0; i < len; ++i)
			str[i] = tolower((unsigned char)path[i]);
	} else {
		memcpy(str, path, len);
	}
	str[len] = '\0';

	return (str);
}